

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.cpp
# Opt level: O1

GrowingUint32HeapArray *
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(uint32 _length)

{
  HeapAllocator *alloc;
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&GrowingArray<unsigned_int,Memory::HeapAllocator>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26a116d;
  data.filename._0_4_ = 0xe;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this = (GrowingArray<unsigned_int,_Memory::HeapAllocator> *)
         new<Memory::HeapAllocator>(0x18,alloc,0x300d4a);
  this->buffer = (Type)0x0;
  this->count = 0;
  this->length = _length;
  this->alloc = &Memory::HeapAllocator::Instance;
  EnsureArray(this);
  return this;
}

Assistant:

GrowingUint32HeapArray* GrowingArray<uint32, HeapAllocator>::Create(uint32 _length)
    {
        return HeapNew(GrowingUint32HeapArray, &HeapAllocator::Instance, _length);
    }